

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.cc
# Opt level: O3

string * __thiscall
pstack::CacheReader::readString_abi_cxx11_(string *__return_storage_ptr__,CacheReader *this,Off off)

{
  undefined1 *puVar1;
  _Node_iterator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>
  _Var2;
  pair<std::__detail::_Node_iterator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>,_bool>
  pVar3;
  undefined7 uStack_77;
  string local_68;
  Off local_40;
  CacheReader *local_38;
  
  puVar1 = (undefined1 *)((long)&local_68.field_2 + 8);
  local_68.field_2._M_local_buf[8] = '\0';
  local_68.field_2._9_7_ = uStack_77;
  local_68.field_2._M_allocated_capacity = 0;
  local_68._M_dataplus._M_p = (pointer)off;
  local_68._M_string_length = (size_type)puVar1;
  local_40 = off;
  local_38 = this;
  pVar3 = std::
          _Hashtable<unsigned_long,std::pair<unsigned_long_const,std::__cxx11::string>,std::allocator<std::pair<unsigned_long_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
          ::_M_emplace<std::pair<unsigned_long,std::__cxx11::string>>
                    ((_Hashtable<unsigned_long,std::pair<unsigned_long_const,std::__cxx11::string>,std::allocator<std::pair<unsigned_long_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                      *)&this->stringCache,&local_68);
  _Var2 = pVar3.first.
          super__Node_iterator_base<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
          ._M_cur;
  if ((undefined1 *)local_68._M_string_length != puVar1) {
    operator_delete((void *)local_68._M_string_length,
                    CONCAT71(local_68.field_2._9_7_,local_68.field_2._M_local_buf[8]) + 1);
  }
  if (((undefined1  [16])pVar3 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    Reader::readString_abi_cxx11_(&local_68,&local_38->super_Reader,local_40);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)_Var2.
                      super__Node_iterator_base<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                      ._M_cur + 0x10),&local_68);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,
             *(long *)((long)_Var2.
                             super__Node_iterator_base<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                             ._M_cur + 0x10),
             *(long *)((long)_Var2.
                             super__Node_iterator_base<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                             ._M_cur + 0x18) +
             *(long *)((long)_Var2.
                             super__Node_iterator_base<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                             ._M_cur + 0x10));
  return __return_storage_ptr__;
}

Assistant:

string
CacheReader::readString(Off off) const
{
    auto [it, neu] = stringCache.insert(std::make_pair(off, std::string{}));
    if (neu)
        it->second = Reader::readString(off);
    return it->second;
}